

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rshapes.c
# Opt level: O1

void DrawCircleSector(Vector2 center,float radius,float startAngle,float endAngle,int segments,
                     Color color)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint uVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float local_b8;
  float fStack_b4;
  float local_88;
  float fStack_84;
  float local_78;
  float fStack_74;
  
  fVar10 = (float)(~-(uint)(0.0 < radius) & 0x3dcccccd | (uint)radius & -(uint)(0.0 < radius));
  fVar9 = endAngle;
  if (startAngle <= endAngle) {
    fVar9 = startAngle;
    startAngle = endAngle;
  }
  fVar5 = startAngle - fVar9;
  fVar6 = ceilf(fVar5 / 90.0);
  if (segments < (int)fVar6) {
    fVar7 = -0.5 / fVar10 + 1.0;
    fVar7 = fVar7 * fVar7;
    fVar7 = acosf(fVar7 + fVar7 + -1.0);
    fVar7 = ceilf(6.2831855 / fVar7);
    uVar3 = (uint)((fVar7 * fVar5) / 360.0);
    segments = (int)fVar6;
    if (0 < (int)uVar3) {
      segments = uVar3;
    }
  }
  fVar5 = fVar5 / (float)segments;
  rlSetTexture(texShapes.id);
  uVar2 = texShapesRec._8_8_;
  uVar1 = texShapesRec._0_8_;
  rlBegin(7);
  local_88 = (float)uVar1;
  fStack_84 = SUB84(uVar1,4);
  fStack_b4 = center.y;
  local_78 = (float)uVar2;
  fStack_74 = SUB84(uVar2,4);
  local_b8 = center.x;
  if (1 < segments) {
    iVar4 = segments / 2;
    fVar6 = fVar9;
    do {
      rlColor4ub(color.r,color.g,color.b,color.a);
      rlTexCoord2f(local_88 / (float)texShapes.width,fStack_84 / (float)texShapes.height);
      rlVertex2f(local_b8,fStack_b4);
      rlTexCoord2f((local_88 + local_78) / (float)texShapes.width,
                   fStack_84 / (float)texShapes.height);
      fVar9 = fVar5 + fVar5 + fVar6;
      fVar7 = cosf(fVar9 * 0.017453292);
      fVar8 = sinf(fVar9 * 0.017453292);
      rlVertex2f(fVar7 * fVar10 + local_b8,fVar8 * fVar10 + fStack_b4);
      rlTexCoord2f((local_88 + local_78) / (float)texShapes.width,
                   (fStack_84 + fStack_74) / (float)texShapes.height);
      fVar7 = (fVar5 + fVar6) * 0.017453292;
      fVar8 = cosf(fVar7);
      fVar7 = sinf(fVar7);
      rlVertex2f(fVar8 * fVar10 + local_b8,fVar7 * fVar10 + fStack_b4);
      rlTexCoord2f(local_88 / (float)texShapes.width,
                   (fStack_84 + fStack_74) / (float)texShapes.height);
      fVar7 = cosf(fVar6 * 0.017453292);
      fVar6 = sinf(fVar6 * 0.017453292);
      rlVertex2f(fVar7 * fVar10 + local_b8,fVar6 * fVar10 + fStack_b4);
      iVar4 = iVar4 + -1;
      fVar6 = fVar9;
    } while (iVar4 != 0);
  }
  if ((segments & 1U) != 0) {
    rlColor4ub(color.r,color.g,color.b,color.a);
    rlTexCoord2f(local_88 / (float)texShapes.width,fStack_84 / (float)texShapes.height);
    rlVertex2f(local_b8,fStack_b4);
    rlTexCoord2f((local_78 + local_88) / (float)texShapes.width,
                 (fStack_74 + fStack_84) / (float)texShapes.height);
    fVar5 = (fVar5 + fVar9) * 0.017453292;
    fVar6 = cosf(fVar5);
    fVar5 = sinf(fVar5);
    rlVertex2f(fVar6 * fVar10 + local_b8,fVar5 * fVar10 + fStack_b4);
    rlTexCoord2f(local_88 / (float)texShapes.width,(fStack_74 + fStack_84) / (float)texShapes.height
                );
    fVar5 = cosf(fVar9 * 0.017453292);
    fVar9 = sinf(fVar9 * 0.017453292);
    rlVertex2f(fVar5 * fVar10 + local_b8,fVar10 * fVar9 + fStack_b4);
    rlTexCoord2f((local_78 + local_88) / (float)texShapes.width,fStack_84 / (float)texShapes.height)
    ;
    rlVertex2f(local_b8,fStack_b4);
  }
  rlEnd();
  rlSetTexture(0);
  return;
}

Assistant:

void DrawCircleSector(Vector2 center, float radius, float startAngle, float endAngle, int segments, Color color)
{
    if (radius <= 0.0f) radius = 0.1f;  // Avoid div by zero

    // Function expects (endAngle > startAngle)
    if (endAngle < startAngle)
    {
        // Swap values
        float tmp = startAngle;
        startAngle = endAngle;
        endAngle = tmp;
    }

    int minSegments = (int)ceilf((endAngle - startAngle)/90);

    if (segments < minSegments)
    {
        // Calculate the maximum angle between segments based on the error rate (usually 0.5f)
        float th = acosf(2*powf(1 - SMOOTH_CIRCLE_ERROR_RATE/radius, 2) - 1);
        segments = (int)((endAngle - startAngle)*ceilf(2*PI/th)/360);

        if (segments <= 0) segments = minSegments;
    }

    float stepLength = (endAngle - startAngle)/(float)segments;
    float angle = startAngle;

#if defined(SUPPORT_QUADS_DRAW_MODE)
    rlSetTexture(GetShapesTexture().id);
    Rectangle shapeRect = GetShapesTextureRectangle();

    rlBegin(RL_QUADS);

        // NOTE: Every QUAD actually represents two segments
        for (int i = 0; i < segments/2; i++)
        {
            rlColor4ub(color.r, color.g, color.b, color.a);

            rlTexCoord2f(shapeRect.x/texShapes.width, shapeRect.y/texShapes.height);
            rlVertex2f(center.x, center.y);

            rlTexCoord2f((shapeRect.x + shapeRect.width)/texShapes.width, shapeRect.y/texShapes.height);
            rlVertex2f(center.x + cosf(DEG2RAD*(angle + stepLength*2.0f))*radius, center.y + sinf(DEG2RAD*(angle + stepLength*2.0f))*radius);

            rlTexCoord2f((shapeRect.x + shapeRect.width)/texShapes.width, (shapeRect.y + shapeRect.height)/texShapes.height);
            rlVertex2f(center.x + cosf(DEG2RAD*(angle + stepLength))*radius, center.y + sinf(DEG2RAD*(angle + stepLength))*radius);

            rlTexCoord2f(shapeRect.x/texShapes.width, (shapeRect.y + shapeRect.height)/texShapes.height);
            rlVertex2f(center.x + cosf(DEG2RAD*angle)*radius, center.y + sinf(DEG2RAD*angle)*radius);

            angle += (stepLength*2.0f);
        }

        // NOTE: In case number of segments is odd, we add one last piece to the cake
        if ((((unsigned int)segments)%2) == 1)
        {
            rlColor4ub(color.r, color.g, color.b, color.a);

            rlTexCoord2f(shapeRect.x/texShapes.width, shapeRect.y/texShapes.height);
            rlVertex2f(center.x, center.y);

            rlTexCoord2f((shapeRect.x + shapeRect.width)/texShapes.width, (shapeRect.y + shapeRect.height)/texShapes.height);
            rlVertex2f(center.x + cosf(DEG2RAD*(angle + stepLength))*radius, center.y + sinf(DEG2RAD*(angle + stepLength))*radius);

            rlTexCoord2f(shapeRect.x/texShapes.width, (shapeRect.y + shapeRect.height)/texShapes.height);
            rlVertex2f(center.x + cosf(DEG2RAD*angle)*radius, center.y + sinf(DEG2RAD*angle)*radius);

            rlTexCoord2f((shapeRect.x + shapeRect.width)/texShapes.width, shapeRect.y/texShapes.height);
            rlVertex2f(center.x, center.y);
        }

    rlEnd();

    rlSetTexture(0);
#else
    rlBegin(RL_TRIANGLES);
        for (int i = 0; i < segments; i++)
        {
            rlColor4ub(color.r, color.g, color.b, color.a);

            rlVertex2f(center.x, center.y);
            rlVertex2f(center.x + cosf(DEG2RAD*(angle + stepLength))*radius, center.y + sinf(DEG2RAD*(angle + stepLength))*radius);
            rlVertex2f(center.x + cosf(DEG2RAD*angle)*radius, center.y + sinf(DEG2RAD*angle)*radius);

            angle += stepLength;
        }
    rlEnd();
#endif
}